

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O0

int Gla_ManTranslate_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vGla,int nUsageCount)

{
  int iVar1;
  int iVar2;
  int i;
  Gia_Obj_t *pGVar3;
  bool local_51;
  int Value1;
  int Value0;
  int nUsageCount_local;
  Vec_Int_t *vGla_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsTravIdCurrent(p,pObj);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrent(p,pObj);
    iVar1 = Gia_ObjIsCi(pObj);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsAnd(pObj);
      if (iVar1 == 0) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                      ,0x499,"int Gla_ManTranslate_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, int)")
        ;
      }
      pGVar3 = Gia_ObjFanin0(pObj);
      iVar1 = Gla_ManTranslate_rec(p,pGVar3,vGla,nUsageCount);
      pGVar3 = Gia_ObjFanin1(pObj);
      iVar2 = Gla_ManTranslate_rec(p,pGVar3,vGla,nUsageCount);
      if ((iVar1 != 0) || (iVar2 != 0)) {
        i = Gia_ObjId(p,pObj);
        Vec_IntAddToEntry(vGla,i,nUsageCount);
      }
      local_51 = iVar1 != 0 || iVar2 != 0;
      p_local._4_4_ = (uint)local_51;
    }
    else {
      p_local._4_4_ = 0;
    }
  }
  else {
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

int Gla_ManTranslate_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vGla, int nUsageCount )
{
    int Value0, Value1;
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return 1;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( Gia_ObjIsCi(pObj) )
        return 0;
    assert( Gia_ObjIsAnd(pObj) );
    Value0 = Gla_ManTranslate_rec( p, Gia_ObjFanin0(pObj), vGla, nUsageCount );
    Value1 = Gla_ManTranslate_rec( p, Gia_ObjFanin1(pObj), vGla, nUsageCount );
    if ( Value0 || Value1 )
        Vec_IntAddToEntry( vGla, Gia_ObjId(p, pObj), nUsageCount );
    return Value0 || Value1;
}